

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool __thiscall
SingleNodeColumnSampler<long_double,_float>::sample_col
          (SingleNodeColumnSampler<long_double,_float> *this,size_t *col_chosen,
          Xoshiro256PP *rnd_generator)

{
  long lVar1;
  longdouble lVar2;
  bool bVar3;
  double *pdVar4;
  runtime_error *this_00;
  result_type __n;
  reference pvVar5;
  reference pvVar6;
  value_type *in_RSI;
  long *in_RDI;
  longdouble in_ST0;
  result_type_conflict1 rVar7;
  double dVar8;
  size_t lev_1;
  size_t lev;
  double curr_subrange;
  double w_left;
  double rnd_subrange;
  size_t curr_ix;
  size_t chosen_2;
  size_t col_2;
  longdouble cumw_;
  longdouble chosen;
  size_t col_1;
  size_t col;
  size_t curr;
  size_t chosen_1;
  Xoshiro256PP *in_stack_fffffffffffffd18;
  Xoshiro256PP *__urng;
  undefined2 in_stack_fffffffffffffd20;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffd22;
  undefined6 in_stack_fffffffffffffd32;
  undefined2 in_stack_fffffffffffffd38;
  undefined6 in_stack_fffffffffffffd3a;
  undefined6 uVar10;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd40;
  undefined2 in_stack_fffffffffffffd48;
  undefined6 uStack_2b6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 uVar11;
  undefined6 in_stack_fffffffffffffd60;
  undefined2 in_stack_fffffffffffffd66;
  undefined8 in_stack_fffffffffffffd68;
  int __val;
  ulong local_268;
  ulong local_250;
  size_type local_230;
  ulong local_210;
  longdouble local_208;
  uniform_real_distribution<long_double> local_1f8;
  undefined1 local_1ba;
  string local_90 [32];
  ulong local_70;
  reference local_68;
  reference local_58;
  ulong local_48;
  result_type local_40;
  result_type local_28;
  value_type *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 0x59) & 1) != 0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x4bd1cf);
      *in_RDI = (long)pdVar4;
    }
    __val = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    if (in_RDI[8] != 0) {
      std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                ((uniform_int_distribution<unsigned_long> *)
                 CONCAT62(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
                 (unsigned_long)in_stack_fffffffffffffd18,0x4bd208);
      local_28 = std::uniform_int_distribution<unsigned_long>::operator()
                           ((uniform_int_distribution<unsigned_long> *)
                            CONCAT62(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
                            in_stack_fffffffffffffd18);
      local_40 = 0;
      for (local_48 = 0; __val = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
          local_48 < (ulong)in_RDI[10]; local_48 = local_48 + 1) {
        local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (in_stack_fffffffffffffd40,
                              CONCAT62(in_stack_fffffffffffffd3a,in_stack_fffffffffffffd38));
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_58);
        local_40 = bVar3 + local_40;
        if (local_40 == local_28) {
          *local_18 = *(value_type *)(in_RDI[9] + local_48 * 8);
          in_RDI[8] = in_RDI[8] + -1;
          local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffffd40,
                                CONCAT62(in_stack_fffffffffffffd3a,in_stack_fffffffffffffd38));
          std::_Bit_reference::operator=(&local_68,false);
          in_RDI[0xf] = in_RDI[0xf] + -1;
          return true;
        }
      }
    }
    if (in_RDI[0xf] == 0) {
      local_1 = false;
    }
    else {
      if (*(longdouble *)(in_RDI + 6) <= (longdouble)0) {
        *(longdouble *)(in_RDI + 6) = (longdouble)0;
        for (local_70 = 0; local_70 < (ulong)in_RDI[10]; local_70 = local_70 + 1) {
          *(longdouble *)(in_RDI + 6) =
               *(longdouble *)(in_RDI + 6) +
               (longdouble)*(double *)(*in_RDI + *(long *)(in_RDI[9] + local_70 * 8) * 8);
        }
        if (*(longdouble *)(in_RDI + 6) <= (longdouble)0) {
          local_1ba = 1;
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60),
                     (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (allocator<char> *)in_stack_fffffffffffffd50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60),
                     (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (allocator<char> *)in_stack_fffffffffffffd50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         in_stack_fffffffffffffd50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60),
                     (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (allocator<char> *)in_stack_fffffffffffffd50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         in_stack_fffffffffffffd50);
          std::__cxx11::to_string(__val);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         in_stack_fffffffffffffd50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60),
                     (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (allocator<char> *)in_stack_fffffffffffffd50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                         in_stack_fffffffffffffd50);
          std::runtime_error::runtime_error(this_00,local_90);
          local_1ba = 0;
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      lVar2 = (longdouble)0;
      uVar11 = SUB104(lVar2,0);
      uVar10 = (undefined6)((unkuint10)lVar2 >> 0x20);
      __urng = SUB108(lVar2,0);
      uVar9 = (undefined2)((unkuint10)lVar2 >> 0x40);
      std::uniform_real_distribution<long_double>::uniform_real_distribution
                (&local_1f8,
                 (longdouble)CONCAT28(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40),
                 (longdouble)
                 CONCAT28(in_stack_fffffffffffffd38,
                          CONCAT62(in_stack_fffffffffffffd32,
                                   (short)((unkuint10)*(unkbyte10 *)(in_RDI + 6) >> 0x40))));
      std::uniform_real_distribution<long_double>::operator()
                ((uniform_real_distribution<long_double> *)CONCAT62(in_stack_fffffffffffffd22,uVar9)
                 ,__urng);
      local_208 = (longdouble)CONCAT64(uVar10,uVar11);
      for (local_210 = 0; local_210 < (ulong)in_RDI[10]; local_210 = local_210 + 1) {
        local_208 = local_208 +
                    (longdouble)*(double *)(*in_RDI + *(long *)(in_RDI[9] + local_210 * 8) * 8);
        if (in_ST0 <= local_208) {
          *local_18 = *(value_type *)(in_RDI[9] + local_210 * 8);
          *(longdouble *)(in_RDI + 6) =
               *(longdouble *)(in_RDI + 6) - (longdouble)*(double *)(*in_RDI + *local_18 * 8);
          *(undefined8 *)(*in_RDI + *local_18 * 8) = 0;
          in_RDI[0xf] = in_RDI[0xf] + -1;
          return true;
        }
      }
      *local_18 = *(value_type *)(in_RDI[9] + -8 + in_RDI[10] * 8);
      *(longdouble *)(in_RDI + 6) =
           *(longdouble *)(in_RDI + 6) - (longdouble)*(double *)(*in_RDI + *local_18 * 8);
      *(undefined8 *)(*in_RDI + *local_18 * 8) = 0;
      in_RDI[0xf] = in_RDI[0xf] + -1;
      local_1 = true;
    }
  }
  else if (in_RDI[8] == 0) {
    if (in_RDI[0xf] == 0) {
      local_1 = false;
    }
    else {
      local_230 = 0;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),0);
      if (0.0 < *pvVar6) {
        for (local_250 = 0; local_250 < (ulong)in_RDI[0x14]; local_250 = local_250 + 1) {
          std::uniform_real_distribution<double>::uniform_real_distribution
                    ((uniform_real_distribution<double> *)
                     CONCAT62(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
                     (double)in_stack_fffffffffffffd18,2.45605022610707e-317);
          rVar7 = std::uniform_real_distribution<double>::operator()
                            ((uniform_real_distribution<double> *)
                             CONCAT62(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
                             in_stack_fffffffffffffd18);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                              local_230 * 2 + 1);
          local_230 = local_230 * 2 + 1 + (ulong)(*pvVar6 <= rVar7);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),local_230);
        }
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18)
                            ,local_230 - in_RDI[0x13]);
        *local_18 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),local_230);
        *pvVar6 = 0.0;
        for (local_268 = 0; local_268 < (ulong)in_RDI[0x14]; local_268 = local_268 + 1) {
          local_230 = local_230 - 1 >> 1;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                              local_230 * 2 + 1);
          uVar9 = SUB82(*pvVar6,0);
          uVar10 = (undefined6)((ulong)*pvVar6 >> 0x10);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),
                              local_230 * 2 + 2);
          dVar8 = (double)CONCAT62(uVar10,uVar9) + *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),local_230);
          *pvVar6 = dVar8;
        }
        in_RDI[0xf] = in_RDI[0xf] + -1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
              ((uniform_int_distribution<unsigned_long> *)
               CONCAT62(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
               (unsigned_long)in_stack_fffffffffffffd18,0x4bd90c);
    __n = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)
                     CONCAT62(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
                     in_stack_fffffffffffffd18);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x1b),__n
                       );
    *local_18 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x1b),__n
                       );
    uVar9 = SUB82(pvVar5,0);
    uStack_2b6 = (undefined6)((ulong)pvVar5 >> 0x10);
    lVar1 = in_RDI[8];
    in_RDI[8] = lVar1 - 1U;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x1b),
                        lVar1 - 1U);
    std::swap<unsigned_long>((unsigned_long *)CONCAT62(uStack_2b6,uVar9),pvVar5);
    in_RDI[0xf] = in_RDI[0xf] + -1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::sample_col(size_t &col_chosen, RNG_engine &rnd_generator)
{
    if (!this->using_tree)
    {
        if (this->backup_weights)
            this->weights_orig = this->weights_own.data();

        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            size_t curr = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                curr += inifinite_weights[this->col_indices[col]];
                if (curr == chosen)
                {
                    col_chosen = this->col_indices[col];
                    this->n_inf--;
                    this->inifinite_weights[col_chosen] = false;
                    this->n_left--;
                    return true;
                }
            }
            assert(0);
        }

        if (!this->n_left) return false;

        /* due to the way this is calculated, there can be large roundoff errors and even negatives */
        if (this->cumw <= 0)
        {
            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
                this->cumw += this->weights_orig[this->col_indices[col]];
            if (unlikely(this->cumw <= 0))
                unexpected_error();
        }

        /* if there are no infinites, choose a column according to weight */
        ldouble_safe chosen = std::uniform_real_distribution<ldouble_safe>((ldouble_safe)0, this->cumw)(rnd_generator);
        ldouble_safe cumw_ = 0;
        for (size_t col = 0; col < this->curr_pos; col++)
        {
            cumw_ += this->weights_orig[this->col_indices[col]];
            if (cumw_ >= chosen)
            {
                col_chosen = this->col_indices[col];
                this->cumw -= this->weights_orig[col_chosen];
                this->weights_orig[col_chosen] = 0;
                this->n_left--;
                return true;
            }
        }
        col_chosen = this->col_indices[this->curr_pos-1];
        this->cumw -= this->weights_orig[col_chosen];
        this->weights_orig[col_chosen] = 0;
        this->n_left--;
        return true;
    }

    else
    {
        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            col_chosen = this->mapped_inf_indices[chosen];
            std::swap(this->mapped_inf_indices[chosen], this->mapped_inf_indices[--this->n_inf]);
            this->n_left--;
            return true;
        }

        else
        {
            /* TODO: should standardize all these tree traversals into one.
               This one in particular could do with sampling only a single
               random number as it will not typically require exhausting all
               options like the usual column sampler. */
            if (!this->n_left) return false;
            size_t curr_ix = 0;
            double rnd_subrange, w_left;
            double curr_subrange = this->tree_weights[0];
            if (curr_subrange <= 0)
                return false;

            for (size_t lev = 0; lev < tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = this->tree_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = this->tree_weights[curr_ix];
            }

            col_chosen = this->mapped_indices[curr_ix - this->offset];

            this->tree_weights[curr_ix] = 0.;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                this->tree_weights[curr_ix] =   this->tree_weights[ix_child(curr_ix)]
                                              + this->tree_weights[ix_child(curr_ix) + 1];
            }
            
            this->n_left--;
            return true;
        }
    }
}